

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTestsUtil.cpp
# Opt level: O1

string * __thiscall
vkt::pipeline::multisample::getImageTypeName_abi_cxx11_
          (string *__return_storage_ptr__,multisample *this,ImageType imageType)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "1d";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "1d_array";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "2d";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "2d_array";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "3d";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "cube";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "cube_array";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "buffer";
    pcVar1 = "";
    break;
  default:
    pcVar1 = "";
    pcVar2 = pcVar1;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string getImageTypeName (const ImageType imageType)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:			return "1d";
		case IMAGE_TYPE_1D_ARRAY:	return "1d_array";
		case IMAGE_TYPE_2D:			return "2d";
		case IMAGE_TYPE_2D_ARRAY:	return "2d_array";
		case IMAGE_TYPE_3D:			return "3d";
		case IMAGE_TYPE_CUBE:		return "cube";
		case IMAGE_TYPE_CUBE_ARRAY:	return "cube_array";
		case IMAGE_TYPE_BUFFER:		return "buffer";

		default:
			DE_ASSERT(false);
			return "";
	}
}